

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O3

json * __thiscall argo::json::insert(json *this,string *name,json *j)

{
  __uniq_ptr_impl<argo::json,_std::default_delete<argo::json>_> _Var1;
  tuple<argo::json_*,_std::default_delete<argo::json>_> this_00;
  json *pjVar2;
  pointer *__ptr;
  __uniq_ptr_impl<argo::json,_std::default_delete<argo::json>_> local_28;
  
  this_00.super__Tuple_impl<0UL,_argo::json_*,_std::default_delete<argo::json>_>.
  super__Head_base<0UL,_argo::json_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_argo::json_*,_std::default_delete<argo::json>_>)operator_new(0x58);
  json((json *)this_00.super__Tuple_impl<0UL,_argo::json_*,_std::default_delete<argo::json>_>.
               super__Head_base<0UL,_argo::json_*,_false>._M_head_impl,j);
  local_28._M_t.super__Tuple_impl<0UL,_argo::json_*,_std::default_delete<argo::json>_>.
  super__Head_base<0UL,_argo::json_*,_false>._M_head_impl =
       (tuple<argo::json_*,_std::default_delete<argo::json>_>)
       (tuple<argo::json_*,_std::default_delete<argo::json>_>)
       this_00.super__Tuple_impl<0UL,_argo::json_*,_std::default_delete<argo::json>_>.
       super__Head_base<0UL,_argo::json_*,_false>._M_head_impl;
  pjVar2 = insert(this,name,(unique_ptr<argo::json,_std::default_delete<argo::json>_> *)&local_28);
  _Var1._M_t.super__Tuple_impl<0UL,_argo::json_*,_std::default_delete<argo::json>_>.
  super__Head_base<0UL,_argo::json_*,_false>._M_head_impl =
       local_28._M_t.super__Tuple_impl<0UL,_argo::json_*,_std::default_delete<argo::json>_>.
       super__Head_base<0UL,_argo::json_*,_false>._M_head_impl;
  if ((_Tuple_impl<0UL,_argo::json_*,_std::default_delete<argo::json>_>)
      local_28._M_t.super__Tuple_impl<0UL,_argo::json_*,_std::default_delete<argo::json>_>.
      super__Head_base<0UL,_argo::json_*,_false>._M_head_impl != (json *)0x0) {
    ~json((json *)local_28._M_t.
                  super__Tuple_impl<0UL,_argo::json_*,_std::default_delete<argo::json>_>.
                  super__Head_base<0UL,_argo::json_*,_false>._M_head_impl);
    operator_delete((void *)_Var1._M_t.
                            super__Tuple_impl<0UL,_argo::json_*,_std::default_delete<argo::json>_>.
                            super__Head_base<0UL,_argo::json_*,_false>._M_head_impl);
  }
  return pjVar2;
}

Assistant:

const json &json::insert(const string &name, const json &j)
{
    return insert(name, unique_ptr<json>(new json(j)));
}